

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_arrow(runtime_type *this,var *a,token_base *b)

{
  bool bVar1;
  runtime_error *this_00;
  proxy *in_RDI;
  any *unaff_retaddr;
  token_base *in_stack_000001e8;
  var *in_stack_000001f0;
  runtime_type *in_stack_000001f8;
  string *in_stack_ffffffffffffff78;
  any *in_stack_ffffffffffffff80;
  type_info *in_stack_ffffffffffffff88;
  allocator *paVar2;
  proxy *this_01;
  allocator local_41;
  string local_40 [64];
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff80);
  bVar1 = std::type_info::operator==((type_info *)this_01,in_stack_ffffffffffffff88);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar2 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Unsupported operator operations(Arraw).",paVar2);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff78);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  cs_impl::any::const_val<cs::pointer>(unaff_retaddr);
  parse_dot(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_arrow(const var &a, token_base *b)
	{
		if (a.type() == typeid(pointer))
			return parse_dot(a.const_val<pointer>().data, b);
		else
			throw runtime_error("Unsupported operator operations(Arraw).");
	}